

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O0

SourceTextModuleRecord * Js::SourceTextModuleRecord::Create(ScriptContext *scriptContext)

{
  Type TVar1;
  Recycler *pRVar2;
  SourceTextModuleRecord *this;
  JavascriptLibrary *this_00;
  ModuleRecordList *this_01;
  TrackAllocData local_48;
  SourceTextModuleRecord *local_20;
  SourceTextModuleRecord *childModuleRecord;
  Recycler *recycler;
  ScriptContext *scriptContext_local;
  
  recycler = (Recycler *)scriptContext;
  pRVar2 = ScriptContext::GetRecycler(scriptContext);
  childModuleRecord = (SourceTextModuleRecord *)pRVar2;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
             ,0x35);
  pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_48);
  this = (SourceTextModuleRecord *)new<Memory::Recycler>(0x120,pRVar2,0x4642b0);
  SourceTextModuleRecord(this,(ScriptContext *)recycler);
  local_20 = this;
  this_00 = ScriptContext::GetLibrary((ScriptContext *)recycler);
  this_01 = JavascriptLibrary::EnsureModuleRecordList(this_00);
  TVar1 = JsUtil::
          List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::Add(this_01,&local_20);
  local_20->moduleId = TVar1;
  return local_20;
}

Assistant:

SourceTextModuleRecord* SourceTextModuleRecord::Create(ScriptContext* scriptContext)
    {
        Recycler* recycler = scriptContext->GetRecycler();
        SourceTextModuleRecord* childModuleRecord;
        childModuleRecord = RecyclerNewFinalized(recycler, Js::SourceTextModuleRecord, scriptContext);
        // There is no real reference to lifetime management in ecmascript
        // The life time of a module record should be controlled by the module registry as defined in WHATWG module loader spec
        // in practice the modulerecord lifetime should be the same as the scriptcontext so it could be retrieved for the same
        // site. Host might hold a reference to the module as well after initializing the module.
        // In our implementation, we'll use the moduleId in bytecode to identify the module.
        childModuleRecord->moduleId = scriptContext->GetLibrary()->EnsureModuleRecordList()->Add(childModuleRecord);

        return childModuleRecord;
    }